

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

cmListFileContext * __thiscall cmListFileBacktrace::Top(cmListFileBacktrace *this)

{
  element_type *peVar1;
  
  peVar1 = (this->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("this->TopEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListFileCache.cxx"
                  ,0x17e,"const cmListFileContext &cmListFileBacktrace::Top() const");
  }
  if ((peVar1->Parent).
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    return (cmListFileContext *)peVar1;
  }
  __assert_fail("!this->TopEntry->IsBottom()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListFileCache.cxx"
                ,0x17f,"const cmListFileContext &cmListFileBacktrace::Top() const");
}

Assistant:

cmListFileContext const& cmListFileBacktrace::Top() const
{
  assert(this->TopEntry);
  assert(!this->TopEntry->IsBottom());
  return this->TopEntry->Context;
}